

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

void * yang_read_range(lys_module *module,yang_type *stype,char *value,int is_ext_instance)

{
  LY_ERR *pLVar1;
  ly_ctx *plVar2;
  lys_module *local_38;
  lys_restr *range;
  int is_ext_instance_local;
  char *value_local;
  yang_type *stype_local;
  lys_module *module_local;
  
  local_38 = (lys_module *)stype;
  if (is_ext_instance == 0) {
    if ((stype->base == LY_TYPE_DER) || (stype->base == LY_TYPE_DEC64)) {
      stype->base = LY_TYPE_DEC64;
      if ((stype->type->info).bits.bit == (lys_type_bit *)0x0) {
        local_38 = (lys_module *)calloc(1,0x38);
        if (local_38 != (lys_module *)0x0) {
          (stype->type->info).bits.bit = (lys_type_bit *)local_38;
          goto LAB_0016ecf6;
        }
        pLVar1 = ly_errno_location();
        *pLVar1 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_range");
      }
      else {
        ly_vlog(LYE_TOOMANY,LY_VLOG_NONE,(void *)0x0,"range","type");
      }
    }
    else {
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Unexpected range statement.");
    }
    free(value);
    module_local = (lys_module *)0x0;
  }
  else {
LAB_0016ecf6:
    plVar2 = (ly_ctx *)lydict_insert_zc(module->ctx,value);
    local_38->ctx = plVar2;
    module_local = local_38;
  }
  return module_local;
}

Assistant:

void *
yang_read_range(struct  lys_module *module, struct yang_type *stype, char *value, int is_ext_instance)
{
    struct lys_restr * range;

    if (is_ext_instance) {
        range = (struct lys_restr *)stype;
    } else {
        if (stype->base != 0 && stype->base != LY_TYPE_DEC64) {
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Unexpected range statement.");
            goto error;
        }
        stype->base = LY_TYPE_DEC64;
        if (stype->type->info.dec64.range) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, "range", "type");
            goto error;
        }
        range = calloc(1, sizeof *range);
        if (!range) {
            LOGMEM;
            goto error;
        }
        stype->type->info.dec64.range = range;
    }
    range->expr = lydict_insert_zc(module->ctx, value);
    return range;

error:
    free(value);
    return NULL;
}